

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

void upb_test_TestExtensions_set_optional_int32_ext
               (upb_test_TestExtensions *msg,int32_t val,upb_Arena *arena)

{
  bool bVar1;
  undefined1 local_4 [4];
  
  if ((upb_test_TestExtensions_optional_int32_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                  ,0xcf6,
                  "void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions *, int32_t, upb_Arena *)"
                 );
  }
  if ((upb_test_TestExtensions_optional_int32_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 0xc0) == 0x40) {
    bVar1 = upb_Message_SetExtension
                      (&msg->base_dont_copy_me__upb_internal_use_only,
                       &upb_test_TestExtensions_optional_int32_ext_ext,local_4,arena);
    if (bVar1) {
      return;
    }
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                  ,0xcfa,
                  "void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions *, int32_t, upb_Arena *)"
                 );
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                ,0xcf8,
                "void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions *, int32_t, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions* msg, int32_t val, upb_Arena* arena) {
  const upb_MiniTableExtension* ext = &upb_test_TestExtensions_optional_int32_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == kUpb_FieldRep_4Byte);
  bool ok = upb_Message_SetExtension((upb_Message*)msg, ext, &val, arena);
  UPB_ASSERT(ok);
}